

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O0

void __thiscall
tchecker::clock_updates_visitor_t::update_sum_to_clock_outside_loop
          (clock_updates_visitor_t *this,typed_lvalue_expression_t *x,typed_lvalue_expression_t *y,
          shared_ptr<const_tchecker::expression_t> *c)

{
  bool bVar1;
  uint *puVar2;
  clock_updates_list_t *pcVar3;
  clock_id_t local_74;
  clock_id_t z_1;
  clock_id_t z;
  range_t<unsigned_int,_unsigned_int> x_instances;
  clock_updates_list_t local_58;
  undefined1 local_40 [8];
  clock_updates_list_t A;
  shared_ptr<const_tchecker::expression_t> *c_local;
  typed_lvalue_expression_t *y_local;
  typed_lvalue_expression_t *x_local;
  clock_updates_visitor_t *this_local;
  
  A._list.super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)c;
  clock_updates_of_all_clock_instances(&local_58,this,y);
  tchecker::operator+((clock_updates_list_t *)local_40,&local_58,
                      (shared_ptr<const_tchecker::expression_t> *)
                      A._list.
                      super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  clock_updates_list_t::~clock_updates_list_t(&local_58);
  _z_1 = extract_lvalue_variable_ids(x);
  bVar1 = single_instance((range_t<unsigned_int,_unsigned_int> *)&z_1);
  if (bVar1) {
    puVar2 = range_t<unsigned_int,_unsigned_int>::begin((range_t<unsigned_int,_unsigned_int> *)&z_1)
    ;
    pcVar3 = clock_updates_map_t::operator[](&this->_u,*puVar2);
    clock_updates_list_t::operator=(pcVar3,(clock_updates_list_t *)local_40);
  }
  else {
    puVar2 = range_t<unsigned_int,_unsigned_int>::begin((range_t<unsigned_int,_unsigned_int> *)&z_1)
    ;
    for (local_74 = *puVar2;
        puVar2 = range_t<unsigned_int,_unsigned_int>::end
                           ((range_t<unsigned_int,_unsigned_int> *)&z_1), local_74 != *puVar2;
        local_74 = local_74 + 1) {
      pcVar3 = clock_updates_map_t::operator[](&this->_u,local_74);
      clock_updates_list_t::absorbing_merge(pcVar3,(clock_updates_list_t *)local_40);
    }
  }
  clock_updates_list_t::~clock_updates_list_t((clock_updates_list_t *)local_40);
  return;
}

Assistant:

void update_sum_to_clock_outside_loop(tchecker::typed_lvalue_expression_t const & x,
                                        tchecker::typed_lvalue_expression_t const & y,
                                        std::shared_ptr<tchecker::expression_t const> const & c)
  {
    tchecker::clock_updates_list_t A = clock_updates_of_all_clock_instances(y) + c;
    tchecker::range_t<tchecker::variable_id_t> x_instances = tchecker::extract_lvalue_variable_ids(x);
    if (single_instance(x_instances)) {
      tchecker::clock_id_t z = x_instances.begin();
      _u[z] = A;
    }
    else {
      for (tchecker::clock_id_t z = x_instances.begin(); z != x_instances.end(); ++z)
        _u[z].absorbing_merge(A);
    }
  }